

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::ruby::RubifyConstant_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,string_view name)

{
  byte bVar1;
  string ret;
  byte *local_98;
  size_type local_90;
  byte local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  size_type local_78;
  byte *local_70;
  AlphaNum local_48;
  
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,name._M_len,this + name._M_len,name._M_str);
  if (local_90 != 0) {
    bVar1 = *local_98;
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      *local_98 = bVar1 - 0x20;
    }
    else if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
      local_48.piece_._M_len = 3;
      local_48.piece_._M_str = "PB_";
      local_78 = local_90;
      local_70 = local_98;
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_48);
      goto LAB_00316c7d;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_98 == &local_88) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_80;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
  }
  __return_storage_ptr__->_M_string_length = local_90;
  local_90 = 0;
  local_88 = 0;
  local_98 = &local_88;
LAB_00316c7d:
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RubifyConstant(absl::string_view name) {
  std::string ret(name);
  if (!ret.empty()) {
    if (IsLower(ret[0])) {
      // If it starts with a lowercase letter, capitalize it.
      ret[0] = UpperChar(ret[0]);
    } else if (!IsAlpha(ret[0])) {
      // Otherwise (e.g. if it begins with an underscore), we need to come up
      // with some prefix that starts with a capital letter. We could be smarter
      // here, e.g. try to strip leading underscores, but this may cause other
      // problems if the user really intended the name. So let's just prepend a
      // well-known suffix.
      return absl::StrCat("PB_", ret);
    }
  }

  return ret;
}